

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

appender __thiscall
fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>
          (detail *this,appender out,unsigned___int128 value,uint prefix,
          basic_format_specs<char> *specs,digit_grouping<char> *grouping)

{
  undefined1 n [16];
  undefined1 value_00 [16];
  int iVar1;
  int iVar2;
  appender aVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  int iVar7;
  char cVar8;
  undefined8 *in_R9;
  ulong size;
  int num_digits;
  undefined4 in_stack_ffffffffffffff78;
  detail local_78 [40];
  anon_class_32_4_dca7119b local_50;
  
  iVar4 = (int)specs;
  n._4_4_ = iVar4;
  n._0_4_ = in_stack_ffffffffffffff78;
  n._8_8_ = grouping;
  iVar2 = iVar4;
  iVar1 = count_digits_fallback<unsigned__int128>
                    ((detail *)
                     out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container,
                     (unsigned___int128)n);
  value_00._4_4_ = iVar2;
  value_00._0_4_ = iVar1;
  value_00._8_8_ = grouping;
  format_decimal<char,unsigned__int128>
            (local_78,(char *)out.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.
                              container,(unsigned___int128)value_00,prefix);
  if (*(char *)(in_R9 + 4) != '\0') {
    pcVar6 = (char *)*in_R9;
    pcVar5 = pcVar6 + in_R9[1];
    iVar2 = 0;
    iVar7 = 0;
    do {
      if (pcVar6 == pcVar5) {
        cVar8 = pcVar5[-1];
        pcVar6 = pcVar5;
      }
      else {
        cVar8 = *pcVar6;
        if ((byte)(cVar8 + 0x81U) < 0x82) goto LAB_001267ac;
        pcVar6 = pcVar6 + 1;
      }
      iVar7 = iVar7 + cVar8;
      if (iVar1 <= iVar7) goto LAB_001267ac;
      iVar2 = iVar2 + 1;
    } while( true );
  }
  iVar2 = 0;
LAB_001267ac:
  size = (ulong)(((iVar1 + 1) - (uint)(iVar4 == 0)) + iVar2);
  local_50.prefix = (uint *)&stack0xffffffffffffff7c;
  local_50.digits = (char (*) [40])local_78;
  local_50.num_digits = (int *)&stack0xffffffffffffff78;
  aVar3 = write_padded<(fmt::v8::align::type)2,fmt::v8::appender,char,fmt::v8::detail::write_int_localized<fmt::v8::appender,unsigned__int128,char>(fmt::v8::appender,unsigned__int128,unsigned_int,fmt::v8::basic_format_specs<char>const&,fmt::v8::detail::digit_grouping<char>const&)::_lambda(fmt::v8::appender)_1_>
                    ((appender)this,(basic_format_specs<char> *)grouping,size,size,&local_50);
  return (appender)aVar3.super_back_insert_iterator<fmt::v8::detail::buffer<char>_>.container;
}

Assistant:

auto write_int_localized(OutputIt out, UInt value, unsigned prefix,
                         const basic_format_specs<Char>& specs,
                         const digit_grouping<Char>& grouping) -> OutputIt {
  static_assert(std::is_same<uint64_or_128_t<UInt>, UInt>::value, "");
  int num_digits = count_digits(value);
  char digits[40];
  format_decimal(digits, value, num_digits);
  unsigned size = to_unsigned((prefix != 0 ? 1 : 0) + num_digits +
                              grouping.count_separators(num_digits));
  return write_padded<align::right>(
      out, specs, size, size, [&](reserve_iterator<OutputIt> it) {
        if (prefix != 0) *it++ = static_cast<Char>(prefix);
        return grouping.apply(it, string_view(digits, to_unsigned(num_digits)));
      });
}